

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_log.c
# Opt level: O0

int test_log(void)

{
  uint local_18c;
  char local_188 [4];
  int i;
  char logfile [256];
  char cwd [128];
  
  memset(logfile + 0xf8,0,0x80);
  memset(local_188,0,0x100);
  getcwd(logfile + 0xf8,0x80);
  sprintf(local_188,"%s/%s",logfile + 0xf8,"test.log");
  qc_log_init(local_188,8,10,5);
  _qc_info("log test start...");
  for (local_18c = 0; (int)local_18c < 30000; local_18c = local_18c + 1) {
    _qc_pdebug("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/test/test_log.c"
               ,0x37,1,"test debug(level%d) out =========================================== %d",1,
               (ulong)local_18c);
    _qc_pdebug("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/test/test_log.c"
               ,0x38,2,"test debug(level%d) out =========================================== %d",2,
               (ulong)local_18c);
    _qc_pdebug("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/test/test_log.c"
               ,0x39,3,"test debug(level%d) out =========================================== %d",3,
               (ulong)local_18c);
    _qc_pdebug("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/test/test_log.c"
               ,0x3a,4,"test debug(level%d) out =========================================== %d",4,
               (ulong)local_18c);
    _qc_pdebug("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/test/test_log.c"
               ,0x3b,5,"test debug(level%d) out =========================================== %d",5,
               (ulong)local_18c);
    _qc_pdebug("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/test/test_log.c"
               ,0x3c,6,"test debug(level%d) out =========================================== %d",6,
               (ulong)local_18c);
    _qc_pdebug("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/test/test_log.c"
               ,0x3d,7,"test debug(level%d) out =========================================== %d",7,
               (ulong)local_18c);
    _qc_pdebug("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/test/test_log.c"
               ,0x3e,8,"test debug(level%d) out =========================================== %d",8,
               (ulong)local_18c);
    _qc_pdebug("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/test/test_log.c"
               ,0x3f,9,"test debug(level%d) out =========================================== %d",9,
               (ulong)local_18c);
    _qc_pdebug("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/test/test_log.c"
               ,0x40,10,"test debug(level%d) out =========================================== %d",10,
               (ulong)local_18c);
  }
  _qc_info("log test stoped!");
  return 0;
}

Assistant:

int test_log()
{
    char cwd[128];
    char logfile[256];

    memset(cwd, 0, sizeof(cwd));
    memset(logfile, 0, sizeof(logfile));

    getcwd(cwd, sizeof(cwd));

    sprintf(logfile, "%s/%s", cwd, "test.log");

    qc_log_init(logfile, 8, 10, 5);

    qc_info("log test start...");

    for(int i=0; i<30000; i++)
    {
        qc_pdebug(1, "test debug(level%d) out =========================================== %d", 1, i);
        qc_pdebug(2, "test debug(level%d) out =========================================== %d", 2, i);
        qc_pdebug(3, "test debug(level%d) out =========================================== %d", 3, i);
        qc_pdebug(4, "test debug(level%d) out =========================================== %d", 4, i);
        qc_pdebug(5, "test debug(level%d) out =========================================== %d", 5, i);
        qc_pdebug(6, "test debug(level%d) out =========================================== %d", 6, i);
        qc_pdebug(7, "test debug(level%d) out =========================================== %d", 7, i);
        qc_pdebug(8, "test debug(level%d) out =========================================== %d", 8, i);
        qc_pdebug(9, "test debug(level%d) out =========================================== %d", 9, i);
        qc_pdebug(10, "test debug(level%d) out =========================================== %d", 10, i);
    }

    qc_info("log test stoped!");

    return 0;
}